

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MQTT.hpp
# Opt level: O0

uint32 __thiscall
Protocol::MQTT::Common::VBInt::readFrom(VBInt *this,uint8 *buffer,uint32 bufLength)

{
  ushort uVar1;
  uint32 bufLength_local;
  uint8 *buffer_local;
  VBInt *this_local;
  
  this->size = 0;
  while( true ) {
    if (bufLength < this->size + 1) {
      return 0xfffffffe;
    }
    (this->field_0).value[this->size] = buffer[this->size];
    uVar1 = this->size;
    this->size = uVar1 + 1;
    if ((this->field_0).value[uVar1] < 0x80) break;
    if (this->size == 4) {
      return 0xffffffff;
    }
  }
  return (uint)this->size;
}

Assistant:

uint32 readFrom(const uint8 * buffer, uint32 bufLength)
                {
                    for (size = 0;;)
                    {
                        if ((uint32)(size+1) > bufLength) return NotEnoughData;
                        value[size] = buffer[size];
                        if (value[size++] < 0x80) break;
                        if (size == 4) return BadData;
                    }
                    return size;
                }